

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMvMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  vfloat<4> vVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  bool bVar5;
  bool bVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  byte bVar23;
  byte bVar24;
  int iVar25;
  AABBNodeMB4D *node1;
  byte bVar26;
  long lVar27;
  byte bVar28;
  NodeRef root;
  size_t sVar29;
  uint uVar30;
  NodeRef *pNVar31;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar32;
  undefined4 uVar33;
  ulong uVar34;
  bool bVar35;
  byte bVar36;
  ulong uVar37;
  ulong uVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [64];
  vint4 ai_2;
  undefined1 auVar60 [16];
  undefined1 in_ZMM2 [64];
  vint4 ai;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  vint4 ai_1;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  vint4 ai_3;
  undefined1 auVar66 [16];
  vint4 bi;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  vint4 bi_1;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  vint4 bi_3;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  vint4 bi_2;
  uint uVar76;
  uint uVar77;
  uint uVar78;
  uint uVar79;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 in_ZMM20 [64];
  undefined1 auVar90 [64];
  Precalculations pre;
  undefined1 local_1958 [16];
  BVH *local_1940;
  Intersectors *local_1938;
  ulong local_1930;
  int local_1928;
  int iStack_1924;
  int iStack_1920;
  int iStack_191c;
  RTCFilterFunctionNArguments args;
  TravRayK<4,_false> tray;
  undefined1 local_17d8 [16];
  undefined1 local_17c8 [16];
  undefined1 local_17b8 [16];
  undefined1 local_17a8 [16];
  undefined1 local_1798 [16];
  undefined1 local_1788 [8];
  float fStack_1780;
  float fStack_177c;
  undefined1 local_1778 [8];
  float fStack_1770;
  float fStack_176c;
  undefined8 local_1768;
  undefined8 uStack_1760;
  undefined8 local_1758;
  undefined8 uStack_1750;
  undefined1 local_1748 [16];
  undefined1 local_1738 [16];
  float local_1728;
  float fStack_1724;
  float fStack_1720;
  float fStack_171c;
  undefined1 local_1718 [16];
  undefined1 local_1708 [16];
  uint local_16f8;
  uint uStack_16f4;
  uint uStack_16f0;
  uint uStack_16ec;
  uint uStack_16e8;
  uint uStack_16e4;
  uint uStack_16e0;
  uint uStack_16dc;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  local_1940 = (BVH *)This->ptr;
  stack_node[1].ptr = (local_1940->root).ptr;
  if (stack_node[1].ptr != 8) {
    auVar41 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
    auVar55 = ZEXT816(0) << 0x40;
    uVar7 = vcmpps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar55,5);
    uVar37 = vpcmpeqd_avx512vl(auVar41,(undefined1  [16])valid_i->field_0);
    uVar37 = ((byte)uVar7 & 0xf) & uVar37;
    bVar36 = (byte)uVar37;
    if (bVar36 != 0) {
      tray.org.field_0._0_4_ = *(undefined4 *)ray;
      tray.org.field_0._4_4_ = *(undefined4 *)(ray + 4);
      tray.org.field_0._8_4_ = *(undefined4 *)(ray + 8);
      tray.org.field_0._12_4_ = *(undefined4 *)(ray + 0xc);
      tray.org.field_0._16_4_ = *(undefined4 *)(ray + 0x10);
      tray.org.field_0._20_4_ = *(undefined4 *)(ray + 0x14);
      tray.org.field_0._24_4_ = *(undefined4 *)(ray + 0x18);
      tray.org.field_0._28_4_ = *(undefined4 *)(ray + 0x1c);
      tray.org.field_0._32_4_ = *(undefined4 *)(ray + 0x20);
      tray.org.field_0._36_4_ = *(undefined4 *)(ray + 0x24);
      tray.org.field_0._40_4_ = *(undefined4 *)(ray + 0x28);
      tray.org.field_0._44_4_ = *(undefined4 *)(ray + 0x2c);
      tray.dir.field_0.field_0.x.field_0 =
           (vfloat_impl<4>)
           *(undefined1 (*) [16])((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(ray + 0x40))->v;
      tray.dir.field_0.field_0.y.field_0 =
           (vfloat_impl<4>)
           *(undefined1 (*) [16])((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(ray + 0x50))->v;
      tray.dir.field_0.field_0.z.field_0 =
           (vfloat_impl<4>)
           *(undefined1 (*) [16])((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(ray + 0x60))->v;
      auVar44._8_4_ = 0x7fffffff;
      auVar44._0_8_ = 0x7fffffff7fffffff;
      auVar44._12_4_ = 0x7fffffff;
      auVar41 = vandps_avx(auVar44,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar39._8_4_ = 0x219392ef;
      auVar39._0_8_ = 0x219392ef219392ef;
      auVar39._12_4_ = 0x219392ef;
      uVar34 = vcmpps_avx512vl(auVar41,auVar39,1);
      bVar35 = (bool)((byte)uVar34 & 1);
      auVar40._0_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * tray.dir.field_0._0_4_;
      bVar35 = (bool)((byte)(uVar34 >> 1) & 1);
      auVar40._4_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * tray.dir.field_0._4_4_;
      bVar35 = (bool)((byte)(uVar34 >> 2) & 1);
      auVar40._8_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * tray.dir.field_0._8_4_;
      bVar35 = (bool)((byte)(uVar34 >> 3) & 1);
      auVar40._12_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * tray.dir.field_0._12_4_;
      auVar41 = vandps_avx(auVar44,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      uVar34 = vcmpps_avx512vl(auVar41,auVar39,1);
      bVar35 = (bool)((byte)uVar34 & 1);
      auVar42._0_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * tray.dir.field_0._16_4_;
      bVar35 = (bool)((byte)(uVar34 >> 1) & 1);
      auVar42._4_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * tray.dir.field_0._20_4_;
      bVar35 = (bool)((byte)(uVar34 >> 2) & 1);
      auVar42._8_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * tray.dir.field_0._24_4_;
      bVar35 = (bool)((byte)(uVar34 >> 3) & 1);
      auVar42._12_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * tray.dir.field_0._28_4_;
      auVar41 = vandps_avx(auVar44,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      uVar34 = vcmpps_avx512vl(auVar41,auVar39,1);
      bVar35 = (bool)((byte)uVar34 & 1);
      auVar47._0_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * tray.dir.field_0._32_4_;
      bVar35 = (bool)((byte)(uVar34 >> 1) & 1);
      auVar47._4_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * tray.dir.field_0._36_4_;
      bVar35 = (bool)((byte)(uVar34 >> 2) & 1);
      auVar47._8_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * tray.dir.field_0._40_4_;
      bVar35 = (bool)((byte)(uVar34 >> 3) & 1);
      auVar47._12_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * tray.dir.field_0._44_4_;
      auVar43._8_4_ = 0x3f800000;
      auVar43._0_8_ = 0x3f8000003f800000;
      auVar43._12_4_ = 0x3f800000;
      auVar39 = vrcp14ps_avx512vl(auVar40);
      auVar41 = vfnmadd213ps_fma(auVar40,auVar39,auVar43);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar41,auVar39,auVar39)
      ;
      auVar40 = vrcp14ps_avx512vl(auVar42);
      auVar41 = vfnmadd213ps_fma(auVar42,auVar40,auVar43);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar41,auVar40,auVar40)
      ;
      auVar40 = vrcp14ps_avx512vl(auVar47);
      auVar41 = vfnmadd213ps_fma(auVar47,auVar40,auVar43);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar41,auVar40,auVar40)
      ;
      tray.org_rdir.field_0._0_4_ = (float)tray.org.field_0._0_4_ * tray.rdir.field_0._0_4_;
      tray.org_rdir.field_0._4_4_ = (float)tray.org.field_0._4_4_ * tray.rdir.field_0._4_4_;
      tray.org_rdir.field_0._8_4_ = (float)tray.org.field_0._8_4_ * tray.rdir.field_0._8_4_;
      tray.org_rdir.field_0._12_4_ = (float)tray.org.field_0._12_4_ * tray.rdir.field_0._12_4_;
      tray.org_rdir.field_0._16_4_ = (float)tray.org.field_0._16_4_ * tray.rdir.field_0._16_4_;
      tray.org_rdir.field_0._20_4_ = (float)tray.org.field_0._20_4_ * tray.rdir.field_0._20_4_;
      tray.org_rdir.field_0._24_4_ = (float)tray.org.field_0._24_4_ * tray.rdir.field_0._24_4_;
      tray.org_rdir.field_0._28_4_ = (float)tray.org.field_0._28_4_ * tray.rdir.field_0._28_4_;
      tray.org_rdir.field_0._32_4_ = (float)tray.org.field_0._32_4_ * tray.rdir.field_0._32_4_;
      tray.org_rdir.field_0._36_4_ = (float)tray.org.field_0._36_4_ * tray.rdir.field_0._36_4_;
      tray.org_rdir.field_0._40_4_ = (float)tray.org.field_0._40_4_ * tray.rdir.field_0._40_4_;
      tray.org_rdir.field_0._44_4_ = (float)tray.org.field_0._44_4_ * tray.rdir.field_0._44_4_;
      uVar34 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar55,1);
      auVar41 = vpbroadcastd_avx512vl(ZEXT416(0x10));
      tray.nearXYZ.field_0._0_4_ = (uint)((byte)uVar34 & 1) * auVar41._0_4_;
      tray.nearXYZ.field_0._4_4_ = (uint)((byte)(uVar34 >> 1) & 1) * auVar41._4_4_;
      tray.nearXYZ.field_0._8_4_ = (uint)((byte)(uVar34 >> 2) & 1) * auVar41._8_4_;
      tray.nearXYZ.field_0._12_4_ = (uint)((byte)(uVar34 >> 3) & 1) * auVar41._12_4_;
      uVar34 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar55,5);
      auVar41 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      bVar35 = (bool)((byte)uVar34 & 1);
      tray.nearXYZ.field_0._16_4_ = (uint)bVar35 * auVar41._0_4_ | (uint)!bVar35 * 0x30;
      bVar35 = (bool)((byte)(uVar34 >> 1) & 1);
      tray.nearXYZ.field_0._20_4_ = (uint)bVar35 * auVar41._4_4_ | (uint)!bVar35 * 0x30;
      bVar35 = (bool)((byte)(uVar34 >> 2) & 1);
      tray.nearXYZ.field_0._24_4_ = (uint)bVar35 * auVar41._8_4_ | (uint)!bVar35 * 0x30;
      bVar35 = (bool)((byte)(uVar34 >> 3) & 1);
      tray.nearXYZ.field_0._28_4_ = (uint)bVar35 * auVar41._12_4_ | (uint)!bVar35 * 0x30;
      uVar34 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar55,5);
      auVar41 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar35 = (bool)((byte)uVar34 & 1);
      tray.nearXYZ.field_0._32_4_ = (uint)bVar35 * auVar41._0_4_ | (uint)!bVar35 * 0x50;
      bVar35 = (bool)((byte)(uVar34 >> 1) & 1);
      tray.nearXYZ.field_0._36_4_ = (uint)bVar35 * auVar41._4_4_ | (uint)!bVar35 * 0x50;
      bVar35 = (bool)((byte)(uVar34 >> 2) & 1);
      tray.nearXYZ.field_0._40_4_ = (uint)bVar35 * auVar41._8_4_ | (uint)!bVar35 * 0x50;
      bVar35 = (bool)((byte)(uVar34 >> 3) & 1);
      tray.nearXYZ.field_0._44_4_ = (uint)bVar35 * auVar41._12_4_ | (uint)!bVar35 * 0x50;
      stack_near[0].field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vbroadcastss_avx512vl(ZEXT416(0x7f800000))
      ;
      auVar88 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      auVar41 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),auVar55);
      tray.tnear.field_0._0_4_ =
           (uint)(bVar36 & 1) * auVar41._0_4_ |
           (uint)!(bool)(bVar36 & 1) * stack_near[0].field_0._0_4_;
      bVar35 = (bool)((byte)(uVar37 >> 1) & 1);
      tray.tnear.field_0._4_4_ =
           (uint)bVar35 * auVar41._4_4_ | (uint)!bVar35 * stack_near[0].field_0._4_4_;
      bVar35 = (bool)((byte)(uVar37 >> 2) & 1);
      tray.tnear.field_0._8_4_ =
           (uint)bVar35 * auVar41._8_4_ | (uint)!bVar35 * stack_near[0].field_0._8_4_;
      bVar35 = SUB81(uVar37 >> 3,0);
      tray.tnear.field_0._12_4_ =
           (uint)bVar35 * auVar41._12_4_ | (uint)!bVar35 * stack_near[0].field_0._12_4_;
      auVar41 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar55);
      tray.tfar.field_0.i[0] =
           (uint)(bVar36 & 1) * auVar41._0_4_ | (uint)!(bool)(bVar36 & 1) * -0x800000;
      bVar35 = (bool)((byte)(uVar37 >> 1) & 1);
      tray.tfar.field_0.i[1] = (uint)bVar35 * auVar41._4_4_ | (uint)!bVar35 * -0x800000;
      bVar35 = (bool)((byte)(uVar37 >> 2) & 1);
      tray.tfar.field_0.i[2] = (uint)bVar35 * auVar41._8_4_ | (uint)!bVar35 * -0x800000;
      bVar35 = SUB81(uVar37 >> 3,0);
      tray.tfar.field_0.i[3] = (uint)bVar35 * auVar41._12_4_ | (uint)!bVar35 * -0x800000;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar30 = 3;
      }
      else {
        uVar30 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pRVar1 = ray + 0x80;
      bVar24 = (byte)((ushort)((short)uVar37 << 0xc) >> 0xc) ^ 0xf;
      pNVar31 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar32 = &stack_near[2].field_0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar41 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar89 = ZEXT1664(auVar41);
      auVar41 = vxorps_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
      auVar90 = ZEXT1664(auVar41);
      local_1938 = This;
LAB_01f3e013:
      do {
        do {
          root.ptr = pNVar31[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_01f3e971;
          pNVar31 = pNVar31 + -1;
          paVar32 = paVar32 + -1;
          vVar2.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar32->v;
          auVar59 = ZEXT1664((undefined1  [16])vVar2.field_0);
          uVar37 = vcmpps_avx512vl((undefined1  [16])vVar2.field_0,
                                   (undefined1  [16])tray.tfar.field_0,1);
        } while ((char)uVar37 == '\0');
        uVar33 = (undefined4)uVar37;
        if (uVar30 < (uint)POPCOUNT(uVar33)) {
LAB_01f3e05b:
          do {
            uVar76 = (uint)root.ptr;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_01f3e971;
              uVar7 = vcmpps_avx512vl(auVar59._0_16_,(undefined1  [16])tray.tfar.field_0,9);
              if ((char)uVar7 == '\0') goto LAB_01f3e013;
              bVar23 = bVar24 & 0xf;
              local_1930 = (ulong)(uVar76 & 0xf) - 8;
              if (local_1930 == 0) goto LAB_01f3e941;
              bVar23 = bVar23 ^ 0xf;
              lVar27 = (root.ptr & 0xfffffffffffffff0) + 0x130;
              uVar37 = 0;
              goto LAB_01f3e3a4;
            }
            uVar7 = vcmpps_avx512vl(auVar59._0_16_,(undefined1  [16])tray.tfar.field_0,9);
            uVar37 = root.ptr & 0xfffffffffffffff0;
            lVar27 = -0x10;
            sVar29 = 8;
            auVar41 = auVar88._0_16_;
            do {
              root.ptr = *(size_t *)(uVar37 + 0x20 + lVar27 * 2);
              if (root.ptr == 8) {
                auVar59 = ZEXT1664(auVar41);
                root.ptr = sVar29;
                break;
              }
              uVar33 = *(undefined4 *)(uVar37 + 0x90 + lVar27);
              auVar61._4_4_ = uVar33;
              auVar61._0_4_ = uVar33;
              auVar61._8_4_ = uVar33;
              auVar61._12_4_ = uVar33;
              auVar55 = *(undefined1 (*) [16])(ray + 0x70);
              uVar33 = *(undefined4 *)(uVar37 + 0x30 + lVar27);
              auVar11._4_4_ = uVar33;
              auVar11._0_4_ = uVar33;
              auVar11._8_4_ = uVar33;
              auVar11._12_4_ = uVar33;
              auVar40 = vfmadd213ps_avx512vl(auVar61,auVar55,auVar11);
              uVar33 = *(undefined4 *)(uVar37 + 0xb0 + lVar27);
              auVar64._4_4_ = uVar33;
              auVar64._0_4_ = uVar33;
              auVar64._8_4_ = uVar33;
              auVar64._12_4_ = uVar33;
              uVar33 = *(undefined4 *)(uVar37 + 0x50 + lVar27);
              auVar12._4_4_ = uVar33;
              auVar12._0_4_ = uVar33;
              auVar12._8_4_ = uVar33;
              auVar12._12_4_ = uVar33;
              auVar42 = vfmadd213ps_avx512vl(auVar64,auVar55,auVar12);
              uVar33 = *(undefined4 *)(uVar37 + 0xd0 + lVar27);
              auVar66._4_4_ = uVar33;
              auVar66._0_4_ = uVar33;
              auVar66._8_4_ = uVar33;
              auVar66._12_4_ = uVar33;
              uVar33 = *(undefined4 *)(uVar37 + 0x70 + lVar27);
              auVar13._4_4_ = uVar33;
              auVar13._0_4_ = uVar33;
              auVar13._8_4_ = uVar33;
              auVar13._12_4_ = uVar33;
              auVar43 = vfmadd213ps_avx512vl(auVar66,auVar55,auVar13);
              uVar33 = *(undefined4 *)(uVar37 + 0xa0 + lVar27);
              auVar67._4_4_ = uVar33;
              auVar67._0_4_ = uVar33;
              auVar67._8_4_ = uVar33;
              auVar67._12_4_ = uVar33;
              uVar33 = *(undefined4 *)(uVar37 + 0x40 + lVar27);
              auVar14._4_4_ = uVar33;
              auVar14._0_4_ = uVar33;
              auVar14._8_4_ = uVar33;
              auVar14._12_4_ = uVar33;
              auVar44 = vfmadd213ps_avx512vl(auVar67,auVar55,auVar14);
              uVar33 = *(undefined4 *)(uVar37 + 0xc0 + lVar27);
              auVar70._4_4_ = uVar33;
              auVar70._0_4_ = uVar33;
              auVar70._8_4_ = uVar33;
              auVar70._12_4_ = uVar33;
              uVar33 = *(undefined4 *)(uVar37 + 0x60 + lVar27);
              auVar15._4_4_ = uVar33;
              auVar15._0_4_ = uVar33;
              auVar15._8_4_ = uVar33;
              auVar15._12_4_ = uVar33;
              auVar45 = vfmadd213ps_avx512vl(auVar70,auVar55,auVar15);
              uVar33 = *(undefined4 *)(uVar37 + 0xe0 + lVar27);
              auVar74._4_4_ = uVar33;
              auVar74._0_4_ = uVar33;
              auVar74._8_4_ = uVar33;
              auVar74._12_4_ = uVar33;
              uVar33 = *(undefined4 *)(uVar37 + 0x80 + lVar27);
              auVar16._4_4_ = uVar33;
              auVar16._0_4_ = uVar33;
              auVar16._8_4_ = uVar33;
              auVar16._12_4_ = uVar33;
              auVar46 = vfmadd213ps_avx512vl(auVar74,auVar55,auVar16);
              auVar21._4_4_ = tray.org_rdir.field_0._4_4_;
              auVar21._0_4_ = tray.org_rdir.field_0._0_4_;
              auVar21._8_4_ = tray.org_rdir.field_0._8_4_;
              auVar21._12_4_ = tray.org_rdir.field_0._12_4_;
              auVar22._4_4_ = tray.org_rdir.field_0._20_4_;
              auVar22._0_4_ = tray.org_rdir.field_0._16_4_;
              auVar22._8_4_ = tray.org_rdir.field_0._24_4_;
              auVar22._12_4_ = tray.org_rdir.field_0._28_4_;
              auVar47 = vfmsub213ps_fma(auVar40,(undefined1  [16])
                                                tray.rdir.field_0.field_0.x.field_0,auVar21);
              auVar39 = vfmsub213ps_fma(auVar42,(undefined1  [16])
                                                tray.rdir.field_0.field_0.y.field_0,auVar22);
              auVar43 = vfmsub213ps_fma(auVar43,(undefined1  [16])
                                                tray.rdir.field_0.field_0.z.field_0,
                                        (undefined1  [16])tray.org_rdir.field_0.field_0.z.field_0);
              auVar44 = vfmsub213ps_fma(auVar44,(undefined1  [16])
                                                tray.rdir.field_0.field_0.x.field_0,auVar21);
              auVar45 = vfmsub213ps_fma(auVar45,(undefined1  [16])
                                                tray.rdir.field_0.field_0.y.field_0,auVar22);
              auVar46 = vfmsub213ps_fma(auVar46,(undefined1  [16])
                                                tray.rdir.field_0.field_0.z.field_0,
                                        (undefined1  [16])tray.org_rdir.field_0.field_0.z.field_0);
              auVar40 = vpminsd_avx(auVar47,auVar44);
              auVar42 = vpminsd_avx(auVar39,auVar45);
              auVar40 = vpmaxsd_avx(auVar40,auVar42);
              auVar42 = vpminsd_avx(auVar43,auVar46);
              auVar40 = vpmaxsd_avx(auVar40,auVar42);
              auVar42 = vpmaxsd_avx(auVar47,auVar44);
              auVar47 = vpmaxsd_avx(auVar39,auVar45);
              auVar47 = vpminsd_avx(auVar42,auVar47);
              auVar42 = vpmaxsd_avx(auVar43,auVar46);
              auVar47 = vpminsd_avx(auVar47,auVar42);
              auVar42 = vpmaxsd_avx(auVar40,(undefined1  [16])tray.tnear.field_0);
              auVar47 = vpminsd_avx(auVar47,(undefined1  [16])tray.tfar.field_0);
              uVar8 = vcmpps_avx512vl(auVar42,auVar47,2);
              bVar23 = (byte)uVar8;
              if ((uVar76 & 7) == 6) {
                uVar33 = *(undefined4 *)(uVar37 + 0x100 + lVar27);
                auVar17._4_4_ = uVar33;
                auVar17._0_4_ = uVar33;
                auVar17._8_4_ = uVar33;
                auVar17._12_4_ = uVar33;
                uVar8 = vcmpps_avx512vl(auVar55,auVar17,1);
                uVar33 = *(undefined4 *)(uVar37 + 0xf0 + lVar27);
                auVar18._4_4_ = uVar33;
                auVar18._0_4_ = uVar33;
                auVar18._8_4_ = uVar33;
                auVar18._12_4_ = uVar33;
                uVar9 = vcmpps_avx512vl(auVar55,auVar18,0xd);
                bVar23 = (byte)uVar8 & (byte)uVar9 & bVar23;
              }
              bVar23 = bVar23 & (byte)uVar7;
              if (bVar23 == 0) {
                auVar59 = ZEXT1664(auVar41);
                root.ptr = sVar29;
              }
              else {
                auVar40 = vblendmps_avx512vl(auVar88._0_16_,auVar40);
                bVar35 = (bool)(bVar23 >> 1 & 1);
                bVar5 = (bool)(bVar23 >> 2 & 1);
                bVar6 = (bool)(bVar23 >> 3 & 1);
                auVar59 = ZEXT1664(CONCAT412((uint)bVar6 * auVar40._12_4_ |
                                             (uint)!bVar6 * auVar55._12_4_,
                                             CONCAT48((uint)bVar5 * auVar40._8_4_ |
                                                      (uint)!bVar5 * auVar55._8_4_,
                                                      CONCAT44((uint)bVar35 * auVar40._4_4_ |
                                                               (uint)!bVar35 * auVar55._4_4_,
                                                               (uint)(bVar23 & 1) * auVar40._0_4_ |
                                                               (uint)!(bool)(bVar23 & 1) *
                                                               auVar55._0_4_))));
                if (sVar29 != 8) {
                  pNVar31->ptr = sVar29;
                  pNVar31 = pNVar31 + 1;
                  *(undefined1 (*) [16])paVar32->v = auVar41;
                  paVar32 = paVar32 + 1;
                }
              }
              auVar41 = auVar59._0_16_;
              lVar27 = lVar27 + 4;
              sVar29 = root.ptr;
            } while (lVar27 != 0);
            iVar25 = 4;
            if (root.ptr == 8) goto LAB_01f3e24d;
            uVar7 = vcmpps_avx512vl((undefined1  [16])auVar59._0_16_,
                                    (undefined1  [16])tray.tfar.field_0,9);
          } while ((byte)uVar30 < (byte)POPCOUNT((int)uVar7));
          pNVar31->ptr = root.ptr;
          pNVar31 = pNVar31 + 1;
          *paVar32 = auVar59._0_16_;
          paVar32 = paVar32 + 1;
        }
        else {
          do {
            sVar29 = 0;
            for (uVar34 = uVar37; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x8000000000000000) {
              sVar29 = sVar29 + 1;
            }
            bVar35 = occluded1(local_1938,local_1940,root,sVar29,&pre,ray,&tray,context);
            bVar23 = (byte)(1 << ((uint)sVar29 & 0x1f));
            if (!bVar35) {
              bVar23 = 0;
            }
            bVar24 = bVar24 | bVar23;
            uVar37 = uVar37 - 1 & uVar37;
          } while (uVar37 != 0);
          iVar25 = 3;
          if (bVar24 != 0xf) {
            auVar41 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            tray.tfar.field_0.i[0] =
                 (uint)(bVar24 & 1) * auVar41._0_4_ |
                 (uint)!(bool)(bVar24 & 1) * tray.tfar.field_0.i[0];
            bVar35 = (bool)(bVar24 >> 1 & 1);
            tray.tfar.field_0.i[1] =
                 (uint)bVar35 * auVar41._4_4_ | (uint)!bVar35 * tray.tfar.field_0.i[1];
            bVar35 = (bool)(bVar24 >> 2 & 1);
            tray.tfar.field_0.i[2] =
                 (uint)bVar35 * auVar41._8_4_ | (uint)!bVar35 * tray.tfar.field_0.i[2];
            bVar35 = (bool)(bVar24 >> 3 & 1);
            tray.tfar.field_0.i[3] =
                 (uint)bVar35 * auVar41._12_4_ | (uint)!bVar35 * tray.tfar.field_0.i[3];
            iVar25 = 2;
          }
          auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
          auVar88 = ZEXT1664(auVar41);
          auVar41 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
          auVar89 = ZEXT1664(auVar41);
          auVar41 = vxorps_avx512vl(auVar90._0_16_,auVar90._0_16_);
          auVar90 = ZEXT1664(auVar41);
          auVar59 = ZEXT1664((undefined1  [16])vVar2.field_0);
          if (uVar30 < (uint)POPCOUNT(uVar33)) goto LAB_01f3e05b;
        }
LAB_01f3e24d:
      } while ((iVar25 == 4) || (iVar25 == 2));
LAB_01f3e971:
      bVar24 = bVar24 & bVar36;
      bVar35 = (bool)(bVar24 >> 1 & 1);
      bVar5 = (bool)(bVar24 >> 2 & 1);
      *(uint *)pRVar1 = (uint)(bVar24 & 1) * -0x800000 | (uint)!(bool)(bVar24 & 1) * *(int *)pRVar1;
      *(uint *)(ray + 0x84) = (uint)bVar35 * -0x800000 | (uint)!bVar35 * *(int *)(ray + 0x84);
      *(uint *)(ray + 0x88) = (uint)bVar5 * -0x800000 | (uint)!bVar5 * *(int *)(ray + 0x88);
      *(uint *)(ray + 0x8c) =
           (uint)(bVar24 >> 3) * -0x800000 | (uint)!(bool)(bVar24 >> 3) * *(int *)(ray + 0x8c);
    }
  }
  return;
  while( true ) {
    uVar37 = uVar37 + 1;
    lVar27 = lVar27 + 0x140;
    if (local_1930 <= uVar37) break;
LAB_01f3e3a4:
    uVar34 = 0;
    bVar28 = bVar23;
    while (uVar38 = (ulong)*(uint *)(lVar27 + -0x10 + uVar34 * 4), uVar38 != 0xffffffff) {
      auVar41 = *(undefined1 (*) [16])(ray + 0x40);
      auVar55 = *(undefined1 (*) [16])(ray + 0x50);
      auVar40 = *(undefined1 (*) [16])(ray + 0x60);
      auVar42 = *(undefined1 (*) [16])(ray + 0x70);
      uVar33 = *(undefined4 *)(lVar27 + -0xa0 + uVar34 * 4);
      auVar62._4_4_ = uVar33;
      auVar62._0_4_ = uVar33;
      auVar62._8_4_ = uVar33;
      auVar62._12_4_ = uVar33;
      uVar33 = *(undefined4 *)(lVar27 + -0x90 + uVar34 * 4);
      auVar68._4_4_ = uVar33;
      auVar68._0_4_ = uVar33;
      auVar68._8_4_ = uVar33;
      auVar68._12_4_ = uVar33;
      uVar33 = *(undefined4 *)(lVar27 + -0x80 + uVar34 * 4);
      auVar71._4_4_ = uVar33;
      auVar71._0_4_ = uVar33;
      auVar71._8_4_ = uVar33;
      auVar71._12_4_ = uVar33;
      uVar33 = *(undefined4 *)(lVar27 + -0x130 + uVar34 * 4);
      auVar45._4_4_ = uVar33;
      auVar45._0_4_ = uVar33;
      auVar45._8_4_ = uVar33;
      auVar45._12_4_ = uVar33;
      auVar44 = vfmadd213ps_avx512vl(auVar62,auVar42,auVar45);
      uVar33 = *(undefined4 *)(lVar27 + -0x120 + uVar34 * 4);
      auVar46._4_4_ = uVar33;
      auVar46._0_4_ = uVar33;
      auVar46._8_4_ = uVar33;
      auVar46._12_4_ = uVar33;
      auVar45 = vfmadd213ps_avx512vl(auVar68,auVar42,auVar46);
      uVar33 = *(undefined4 *)(lVar27 + -0x110 + uVar34 * 4);
      auVar48._4_4_ = uVar33;
      auVar48._0_4_ = uVar33;
      auVar48._8_4_ = uVar33;
      auVar48._12_4_ = uVar33;
      auVar46 = vfmadd213ps_avx512vl(auVar71,auVar42,auVar48);
      uVar33 = *(undefined4 *)(lVar27 + -0x70 + uVar34 * 4);
      auVar57._4_4_ = uVar33;
      auVar57._0_4_ = uVar33;
      auVar57._8_4_ = uVar33;
      auVar57._12_4_ = uVar33;
      uVar33 = *(undefined4 *)(lVar27 + -0x60 + uVar34 * 4);
      auVar60._4_4_ = uVar33;
      auVar60._0_4_ = uVar33;
      auVar60._8_4_ = uVar33;
      auVar60._12_4_ = uVar33;
      uVar33 = *(undefined4 *)(lVar27 + -0x50 + uVar34 * 4);
      auVar80._4_4_ = uVar33;
      auVar80._0_4_ = uVar33;
      auVar80._8_4_ = uVar33;
      auVar80._12_4_ = uVar33;
      uVar33 = *(undefined4 *)(lVar27 + -0x100 + uVar34 * 4);
      auVar49._4_4_ = uVar33;
      auVar49._0_4_ = uVar33;
      auVar49._8_4_ = uVar33;
      auVar49._12_4_ = uVar33;
      auVar47 = vfmadd213ps_avx512vl(auVar57,auVar42,auVar49);
      uVar33 = *(undefined4 *)(lVar27 + -0xf0 + uVar34 * 4);
      auVar50._4_4_ = uVar33;
      auVar50._0_4_ = uVar33;
      auVar50._8_4_ = uVar33;
      auVar50._12_4_ = uVar33;
      auVar39 = vfmadd213ps_avx512vl(auVar60,auVar42,auVar50);
      uVar33 = *(undefined4 *)(lVar27 + -0xe0 + uVar34 * 4);
      auVar10._4_4_ = uVar33;
      auVar10._0_4_ = uVar33;
      auVar10._8_4_ = uVar33;
      auVar10._12_4_ = uVar33;
      auVar43 = vfmadd213ps_avx512vl(auVar80,auVar42,auVar10);
      uVar33 = *(undefined4 *)(lVar27 + -0x40 + uVar34 * 4);
      auVar82._4_4_ = uVar33;
      auVar82._0_4_ = uVar33;
      auVar82._8_4_ = uVar33;
      auVar82._12_4_ = uVar33;
      uVar33 = *(undefined4 *)(lVar27 + -0x30 + uVar34 * 4);
      auVar84._4_4_ = uVar33;
      auVar84._0_4_ = uVar33;
      auVar84._8_4_ = uVar33;
      auVar84._12_4_ = uVar33;
      uVar33 = *(undefined4 *)(lVar27 + -0x20 + uVar34 * 4);
      auVar86._4_4_ = uVar33;
      auVar86._0_4_ = uVar33;
      auVar86._8_4_ = uVar33;
      auVar86._12_4_ = uVar33;
      uVar33 = *(undefined4 *)(lVar27 + -0xd0 + uVar34 * 4);
      auVar54._4_4_ = uVar33;
      auVar54._0_4_ = uVar33;
      auVar54._8_4_ = uVar33;
      auVar54._12_4_ = uVar33;
      auVar48 = vfmadd213ps_avx512vl(auVar82,auVar42,auVar54);
      uVar33 = *(undefined4 *)(lVar27 + -0xc0 + uVar34 * 4);
      auVar53._4_4_ = uVar33;
      auVar53._0_4_ = uVar33;
      auVar53._8_4_ = uVar33;
      auVar53._12_4_ = uVar33;
      auVar49 = vfmadd213ps_avx512vl(auVar84,auVar42,auVar53);
      uVar33 = *(undefined4 *)(lVar27 + -0xb0 + uVar34 * 4);
      auVar51._4_4_ = uVar33;
      auVar51._0_4_ = uVar33;
      auVar51._8_4_ = uVar33;
      auVar51._12_4_ = uVar33;
      auVar50 = vfmadd213ps_avx512vl(auVar86,auVar42,auVar51);
      auVar42 = vsubps_avx(auVar44,auVar47);
      auVar47 = vsubps_avx(auVar45,auVar39);
      auVar39 = vsubps_avx(auVar46,auVar43);
      auVar43 = vsubps_avx(auVar48,auVar44);
      auVar51 = vsubps_avx512vl(auVar49,auVar45);
      auVar52 = vsubps_avx512vl(auVar50,auVar46);
      auVar48 = vmulps_avx512vl(auVar47,auVar52);
      auVar53 = vfmsub231ps_avx512vl(auVar48,auVar51,auVar39);
      auVar58._0_4_ = auVar39._0_4_ * auVar43._0_4_;
      auVar58._4_4_ = auVar39._4_4_ * auVar43._4_4_;
      auVar58._8_4_ = auVar39._8_4_ * auVar43._8_4_;
      auVar58._12_4_ = auVar39._12_4_ * auVar43._12_4_;
      auVar54 = vfmsub231ps_avx512vl(auVar58,auVar52,auVar42);
      auVar48 = vmulps_avx512vl(auVar42,auVar51);
      auVar48 = vfmsub231ps_fma(auVar48,auVar43,auVar47);
      auVar44 = vsubps_avx(auVar44,*(undefined1 (*) [16])ray);
      auVar45 = vsubps_avx(auVar45,*(undefined1 (*) [16])(ray + 0x10));
      auVar46 = vsubps_avx(auVar46,*(undefined1 (*) [16])(ray + 0x20));
      auVar83._0_4_ = auVar55._0_4_ * auVar46._0_4_;
      auVar83._4_4_ = auVar55._4_4_ * auVar46._4_4_;
      auVar83._8_4_ = auVar55._8_4_ * auVar46._8_4_;
      auVar83._12_4_ = auVar55._12_4_ * auVar46._12_4_;
      auVar49 = vfmsub231ps_fma(auVar83,auVar45,auVar40);
      auVar85._0_4_ = auVar40._0_4_ * auVar44._0_4_;
      auVar85._4_4_ = auVar40._4_4_ * auVar44._4_4_;
      auVar85._8_4_ = auVar40._8_4_ * auVar44._8_4_;
      auVar85._12_4_ = auVar40._12_4_ * auVar44._12_4_;
      auVar50 = vfmsub231ps_fma(auVar85,auVar46,auVar41);
      auVar87._0_4_ = auVar41._0_4_ * auVar45._0_4_;
      auVar87._4_4_ = auVar41._4_4_ * auVar45._4_4_;
      auVar87._8_4_ = auVar41._8_4_ * auVar45._8_4_;
      auVar87._12_4_ = auVar41._12_4_ * auVar45._12_4_;
      auVar10 = vfmsub231ps_fma(auVar87,auVar44,auVar55);
      auVar65._0_4_ = auVar48._0_4_ * auVar40._0_4_;
      auVar65._4_4_ = auVar48._4_4_ * auVar40._4_4_;
      auVar65._8_4_ = auVar48._8_4_ * auVar40._8_4_;
      auVar65._12_4_ = auVar48._12_4_ * auVar40._12_4_;
      auVar55 = vfmadd231ps_fma(auVar65,auVar54,auVar55);
      auVar41 = vfmadd231ps_fma(auVar55,auVar53,auVar41);
      auVar40 = vandps_avx512vl(auVar41,auVar89._0_16_);
      auVar55 = vmulps_avx512vl(auVar52,auVar10);
      auVar55 = vfmadd231ps_avx512vl(auVar55,auVar50,auVar51);
      auVar55 = vfmadd231ps_fma(auVar55,auVar49,auVar43);
      uVar76 = auVar40._0_4_;
      auVar52._0_4_ = uVar76 ^ auVar55._0_4_;
      uVar77 = auVar40._4_4_;
      auVar52._4_4_ = uVar77 ^ auVar55._4_4_;
      uVar78 = auVar40._8_4_;
      auVar52._8_4_ = uVar78 ^ auVar55._8_4_;
      uVar79 = auVar40._12_4_;
      auVar52._12_4_ = uVar79 ^ auVar55._12_4_;
      auVar55 = auVar90._0_16_;
      uVar7 = vcmpps_avx512vl(auVar52,auVar55,5);
      bVar26 = (byte)uVar7 & bVar28;
      if (bVar26 == 0) {
LAB_01f3e510:
        bVar26 = 0;
      }
      else {
        auVar81._0_4_ = auVar39._0_4_ * auVar10._0_4_;
        auVar81._4_4_ = auVar39._4_4_ * auVar10._4_4_;
        auVar81._8_4_ = auVar39._8_4_ * auVar10._8_4_;
        auVar81._12_4_ = auVar39._12_4_ * auVar10._12_4_;
        auVar40 = vfmadd213ps_fma(auVar50,auVar47,auVar81);
        auVar40 = vfmadd213ps_fma(auVar49,auVar42,auVar40);
        auVar75._0_4_ = uVar76 ^ auVar40._0_4_;
        auVar75._4_4_ = uVar77 ^ auVar40._4_4_;
        auVar75._8_4_ = uVar78 ^ auVar40._8_4_;
        auVar75._12_4_ = uVar79 ^ auVar40._12_4_;
        uVar7 = vcmpps_avx512vl(auVar75,auVar55,5);
        bVar26 = bVar26 & (byte)uVar7;
        if (bVar26 == 0) goto LAB_01f3e510;
        auVar20._8_4_ = 0x7fffffff;
        auVar20._0_8_ = 0x7fffffff7fffffff;
        auVar20._12_4_ = 0x7fffffff;
        auVar42 = vandps_avx512vl(auVar41,auVar20);
        auVar40 = vsubps_avx(auVar42,auVar52);
        uVar7 = vcmpps_avx512vl(auVar40,auVar75,5);
        bVar26 = bVar26 & (byte)uVar7;
        if (bVar26 == 0) goto LAB_01f3e510;
        auVar72._0_4_ = auVar46._0_4_ * auVar48._0_4_;
        auVar72._4_4_ = auVar46._4_4_ * auVar48._4_4_;
        auVar72._8_4_ = auVar46._8_4_ * auVar48._8_4_;
        auVar72._12_4_ = auVar46._12_4_ * auVar48._12_4_;
        auVar40 = vfmadd213ps_fma(auVar45,auVar54,auVar72);
        auVar40 = vfmadd213ps_fma(auVar44,auVar53,auVar40);
        auVar69._0_4_ = auVar42._0_4_ * *(float *)(ray + 0x30);
        auVar69._4_4_ = auVar42._4_4_ * *(float *)(ray + 0x34);
        auVar69._8_4_ = auVar42._8_4_ * *(float *)(ray + 0x38);
        auVar69._12_4_ = auVar42._12_4_ * *(float *)(ray + 0x3c);
        auVar63._0_4_ = uVar76 ^ auVar40._0_4_;
        auVar63._4_4_ = uVar77 ^ auVar40._4_4_;
        auVar63._8_4_ = uVar78 ^ auVar40._8_4_;
        auVar63._12_4_ = uVar79 ^ auVar40._12_4_;
        auVar73._0_4_ = auVar42._0_4_ * *(float *)(ray + 0x80);
        auVar73._4_4_ = auVar42._4_4_ * *(float *)(ray + 0x84);
        auVar73._8_4_ = auVar42._8_4_ * *(float *)(ray + 0x88);
        auVar73._12_4_ = auVar42._12_4_ * *(float *)(ray + 0x8c);
        uVar7 = vcmpps_avx512vl(auVar63,auVar73,2);
        uVar8 = vcmpps_avx512vl(auVar69,auVar63,1);
        bVar26 = bVar26 & (byte)uVar7 & (byte)uVar8;
        if (bVar26 == 0) {
LAB_01f3e918:
          bVar26 = 0;
          auVar48 = local_17d8;
          auVar54 = local_17c8;
          auVar53 = local_17b8;
          auVar42 = local_17a8;
          auVar63 = local_1798;
          auVar75 = _local_1788;
          auVar52 = _local_1778;
        }
        else {
          uVar7 = vcmpps_avx512vl(auVar41,ZEXT816(0) << 0x20,4);
          bVar26 = bVar26 & (byte)uVar7;
          if (bVar26 == 0) goto LAB_01f3e918;
        }
        _local_1778 = auVar52;
        _local_1788 = auVar75;
        local_1798 = auVar63;
        local_17a8 = auVar42;
        local_17b8 = auVar53;
        local_17c8 = auVar54;
        local_17d8 = auVar48;
        auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar88 = ZEXT1664(auVar41);
        auVar41 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar89 = ZEXT1664(auVar41);
        auVar41 = vxorps_avx512vl(auVar55,auVar55);
        auVar90 = ZEXT1664(auVar41);
      }
      auVar55 = auVar90._0_16_;
      pGVar3 = (context->scene->geometries).items[uVar38].ptr;
      uVar76 = pGVar3->mask;
      auVar41._4_4_ = uVar76;
      auVar41._0_4_ = uVar76;
      auVar41._8_4_ = uVar76;
      auVar41._12_4_ = uVar76;
      uVar7 = vptestmd_avx512vl(auVar41,*(undefined1 (*) [16])(ray + 0x90));
      bVar26 = (byte)uVar7 & 0xf & bVar26;
      uVar38 = (ulong)bVar26;
      if (bVar26 != 0) {
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar41 = vrcp14ps_avx512vl(local_17a8);
          auVar19._8_4_ = 0x3f800000;
          auVar19._0_8_ = 0x3f8000003f800000;
          auVar19._12_4_ = 0x3f800000;
          auVar40 = vfnmadd213ps_avx512vl(auVar41,local_17a8,auVar19);
          auVar41 = vfmadd132ps_fma(auVar40,auVar41,auVar41);
          local_1738._0_4_ = auVar41._0_4_ * (float)local_1778._0_4_;
          local_1738._4_4_ = auVar41._4_4_ * (float)local_1778._4_4_;
          local_1738._8_4_ = auVar41._8_4_ * fStack_1770;
          local_1738._12_4_ = auVar41._12_4_ * fStack_176c;
          local_1728 = auVar41._0_4_ * (float)local_1788._0_4_;
          fStack_1724 = auVar41._4_4_ * (float)local_1788._4_4_;
          fStack_1720 = auVar41._8_4_ * fStack_1780;
          fStack_171c = auVar41._12_4_ * fStack_177c;
          local_1708 = vpbroadcastd_avx512vl();
          local_1718 = vpbroadcastd_avx512vl();
          local_1768 = local_17b8._0_8_;
          uStack_1760 = local_17b8._8_8_;
          local_1758 = local_17c8._0_8_;
          uStack_1750 = local_17c8._8_8_;
          local_1748 = local_17d8;
          vpcmpeqd_avx2(ZEXT1632(local_1738),ZEXT1632(local_1738));
          uStack_16f4 = context->user->instID[0];
          local_16f8 = uStack_16f4;
          uStack_16f0 = uStack_16f4;
          uStack_16ec = uStack_16f4;
          uStack_16e8 = context->user->instPrimID[0];
          uStack_16e4 = uStack_16e8;
          uStack_16e0 = uStack_16e8;
          uStack_16dc = uStack_16e8;
          local_1928 = *(int *)(ray + 0x80);
          iStack_1924 = *(int *)(ray + 0x84);
          iStack_1920 = *(int *)(ray + 0x88);
          iStack_191c = *(int *)(ray + 0x8c);
          auVar41 = vmulps_avx512vl(auVar41,local_1798);
          bVar35 = (bool)(bVar26 >> 1 & 1);
          bVar5 = (bool)(bVar26 >> 2 & 1);
          *(uint *)(ray + 0x80) =
               (uint)(bVar26 & 1) * auVar41._0_4_ | (uint)!(bool)(bVar26 & 1) * local_1928;
          *(uint *)(ray + 0x84) = (uint)bVar35 * auVar41._4_4_ | (uint)!bVar35 * iStack_1924;
          *(uint *)(ray + 0x88) = (uint)bVar5 * auVar41._8_4_ | (uint)!bVar5 * iStack_1920;
          *(uint *)(ray + 0x8c) =
               (uint)(bVar26 >> 3) * auVar41._12_4_ | (uint)!(bool)(bVar26 >> 3) * iStack_191c;
          local_1958 = vpmovm2d_avx512vl((ulong)bVar26);
          args.valid = (int *)local_1958;
          args.geometryUserPtr = pGVar3->userPtr;
          args.context = context->user;
          args.hit = (RTCHitN *)&local_1768;
          args.N = 4;
          args.ray = (RTCRayN *)ray;
          if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            (*pGVar3->occlusionFilterN)(&args);
            auVar41 = vxorps_avx512vl(auVar55,auVar55);
            auVar90 = ZEXT1664(auVar41);
            auVar41 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar89 = ZEXT1664(auVar41);
            auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar88 = ZEXT1664(auVar41);
          }
          auVar41 = auVar90._0_16_;
          uVar38 = vptestmd_avx512vl(local_1958,local_1958);
          if ((uVar38 & 0xf) == 0) {
            uVar38 = 0;
          }
          else {
            p_Var4 = context->args->filter;
            if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var4)(&args);
              auVar41 = vxorps_avx512vl(auVar41,auVar41);
              auVar90 = ZEXT1664(auVar41);
              auVar41 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
              auVar89 = ZEXT1664(auVar41);
              auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar88 = ZEXT1664(auVar41);
            }
            uVar38 = vptestmd_avx512vl(local_1958,local_1958);
            uVar38 = uVar38 & 0xf;
            auVar41 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            bVar35 = (bool)((byte)uVar38 & 1);
            auVar55._0_4_ = (uint)bVar35 * auVar41._0_4_ | (uint)!bVar35 * *(int *)(args.ray + 0x80)
            ;
            bVar35 = (bool)((byte)(uVar38 >> 1) & 1);
            auVar55._4_4_ = (uint)bVar35 * auVar41._4_4_ | (uint)!bVar35 * *(int *)(args.ray + 0x84)
            ;
            bVar35 = (bool)((byte)(uVar38 >> 2) & 1);
            auVar55._8_4_ = (uint)bVar35 * auVar41._8_4_ | (uint)!bVar35 * *(int *)(args.ray + 0x88)
            ;
            bVar35 = SUB81(uVar38 >> 3,0);
            auVar55._12_4_ =
                 (uint)bVar35 * auVar41._12_4_ | (uint)!bVar35 * *(int *)(args.ray + 0x8c);
            *(undefined1 (*) [16])(args.ray + 0x80) = auVar55;
          }
          bVar35 = (bool)((byte)uVar38 & 1);
          auVar56._0_4_ = (uint)bVar35 * *(int *)pRVar1 | (uint)!bVar35 * local_1928;
          bVar35 = (bool)((byte)(uVar38 >> 1) & 1);
          auVar56._4_4_ = (uint)bVar35 * *(int *)(ray + 0x84) | (uint)!bVar35 * iStack_1924;
          bVar35 = (bool)((byte)(uVar38 >> 2) & 1);
          auVar56._8_4_ = (uint)bVar35 * *(int *)(ray + 0x88) | (uint)!bVar35 * iStack_1920;
          bVar35 = SUB81(uVar38 >> 3,0);
          auVar56._12_4_ = (uint)bVar35 * *(int *)(ray + 0x8c) | (uint)!bVar35 * iStack_191c;
          *(undefined1 (*) [16])pRVar1 = auVar56;
        }
        bVar28 = ((byte)uVar38 ^ 0xf) & bVar28;
      }
      if ((bVar28 == 0) || (bVar35 = 2 < uVar34, uVar34 = uVar34 + 1, bVar35)) break;
    }
    bVar23 = bVar23 & bVar28;
    if (bVar23 == 0) break;
  }
  bVar23 = bVar23 ^ 0xf;
LAB_01f3e941:
  bVar24 = bVar23 | bVar24;
  if (bVar24 == 0xf) {
    bVar24 = 0xf;
    goto LAB_01f3e971;
  }
  auVar41 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  tray.tfar.field_0.i[0] =
       (uint)(bVar24 & 1) * auVar41._0_4_ | (uint)!(bool)(bVar24 & 1) * tray.tfar.field_0.i[0];
  bVar35 = (bool)(bVar24 >> 1 & 1);
  tray.tfar.field_0.i[1] = (uint)bVar35 * auVar41._4_4_ | (uint)!bVar35 * tray.tfar.field_0.i[1];
  bVar35 = (bool)(bVar24 >> 2 & 1);
  tray.tfar.field_0.i[2] = (uint)bVar35 * auVar41._8_4_ | (uint)!bVar35 * tray.tfar.field_0.i[2];
  bVar35 = (bool)(bVar24 >> 3 & 1);
  tray.tfar.field_0.i[3] = (uint)bVar35 * auVar41._12_4_ | (uint)!bVar35 * tray.tfar.field_0.i[3];
  goto LAB_01f3e013;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }